

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_request_parsing_simple02_Test::TestBody(http_request_parsing_simple02_Test *this)

{
  size_t *text;
  bool bVar1;
  char *pcVar2;
  mapped_type *this_00;
  reference expected;
  char *in_R9;
  AssertHelper local_108;
  Message local_100;
  allocator local_f1;
  key_type local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_a0;
  Message local_98 [3];
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  http_request request;
  sub_string str;
  http_request_parsing_simple02_Test *this_local;
  
  join_0x00000010_0x00000000_ =
       sub_string::literal<51ul>
                 ((char (*) [51])"GET http://ya.ru/ HTTP/1.1\r\nHost:    ya.ru    \r\n\r\n");
  text = &request.headers._M_t._M_impl.super__Rb_tree_header._M_node_count;
  parse_request((http_request *)&gtest_ar_.message_,(sub_string *)text);
  bVar1 = sub_string::empty((sub_string *)text);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_80,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_80,(AssertionResult *)0x1870b9,"false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"Host",&local_f1);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          *)&request.request_line.version,&local_f0);
  expected = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_00,0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[6]>
            ((EqHelper<false> *)local_d0,"request.headers[\"Host\"][0]","\"ya.ru\"",expected,
             (char (*) [6])"ya.ru");
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  http_request::~http_request((http_request *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(http_request_parsing, simple02)
{
    sub_string str = sub_string::literal("GET http://ya.ru/ HTTP/1.1\r\nHost:    ya.ru    \r\n\r\n");
    http_request request = parse_request(str);
    EXPECT_TRUE(str.empty());
    EXPECT_EQ(request.headers["Host"][0], "ya.ru");
}